

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O0

void __thiscall settings_tests::Merge::test_method(Merge *this)

{
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  uchar *in_RDI;
  long in_FS_OFFSET;
  string *network;
  char *out_path;
  FILE *out_file;
  string out_sha_hex;
  uchar out_sha_bytes [32];
  CHash256 out_sha;
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  system_error *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  lazy_ostream *in_stack_fffffffffffffde8;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffdf8;
  ChainType in_stack_fffffffffffffe0c;
  size_t in_stack_fffffffffffffe48;
  undefined1 local_188 [16];
  undefined1 local_178 [96];
  undefined1 *local_118;
  undefined1 *local_110;
  FILE **local_108;
  FILE *local_100;
  undefined1 local_f8 [64];
  undefined1 local_b8 [32];
  char local_98 [40];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CHash256::CHash256((CHash256 *)in_stack_fffffffffffffdb8);
  local_100 = (FILE *)0x0;
  pcVar2 = getenv("SETTINGS_MERGE_TEST_OUT");
  if (pcVar2 != (char *)0x0) {
    fs::path::path((path *)0xad283a,in_stack_fffffffffffffdb8);
    local_100 = fsbridge::fopen(local_98,"w");
    fs::path::~path((path *)in_stack_fffffffffffffdb8);
    if (local_100 == (FILE *)0x0) {
      uVar3 = __cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::generic_category();
      std::system_error::system_error
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                 (error_category *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_00ad2cdd;
    }
  }
  ChainTypeToString_abi_cxx11_(in_stack_fffffffffffffe0c);
  local_110 = local_70;
  local_108 = &local_100;
  local_118 = local_b8;
  MergeTestingSetup::ForEachMergeSetup<settings_tests::Merge::test_method()::__0>
            ((MergeTestingSetup *)in_stack_fffffffffffffdb8,(anon_class_24_3_9e0baaf7 *)0xad29aa);
  if (local_100 != (FILE *)0x0) {
    iVar1 = fclose(local_100);
    if (iVar1 != 0) {
      uVar3 = __cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::generic_category();
      std::system_error::system_error
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                 (error_category *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_00ad2cdd;
    }
    local_100 = (FILE *)0x0;
  }
  Span<unsigned_char>::Span<32>
            ((Span<unsigned_char> *)in_stack_fffffffffffffdb8,(uchar (*) [32])0xad2ab5);
  output.m_data._4_4_ = in_stack_fffffffffffffdd4;
  output.m_data._0_4_ = in_stack_fffffffffffffdd0;
  output.m_size = (size_t)in_stack_fffffffffffffdd8;
  CHash256::Finalize((CHash256 *)in_stack_fffffffffffffdc8,output);
  Span<const_unsigned_char>::Span<32>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffdb8,(uchar (*) [32])0xad2ae9);
  s.m_size = in_stack_fffffffffffffe48;
  s.m_data = in_RDI;
  HexStr_abi_cxx11_(s);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (unsigned_long)in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffdf8,file,(size_t)in_stack_fffffffffffffde8,
               (const_string *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    in_stack_fffffffffffffde8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdc0,(char (*) [1])in_stack_fffffffffffffdb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (unsigned_long)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffdc8 =
         "\"79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a\"";
    in_stack_fffffffffffffdc0 = "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a";
    in_stack_fffffffffffffdb8 = "out_sha_hex";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_178,local_188,0x10a,1,2,local_f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffde7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffde7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00ad2cdd:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(Merge, MergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("SETTINGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    const std::string& network = ChainTypeToString(ChainType::MAIN);
    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool force_set,
                          bool ignore_default_section_config) {
        std::string desc;
        int value_suffix = 0;
        common::Settings settings;

        const std::string& name = ignore_default_section_config ? "wallet" : "server";
        auto push_values = [&](Action action, const char* value_prefix, const std::string& name_prefix,
                               std::vector<common::SettingsValue>& dest) {
            if (action == SET || action == SECTION_SET) {
                for (int i = 0; i < 2; ++i) {
                    dest.emplace_back(value_prefix + ToString(++value_suffix));
                    desc += " " + name_prefix + name + "=" + dest.back().get_str();
                }
            } else if (action == NEGATE || action == SECTION_NEGATE) {
                dest.emplace_back(false);
                desc += " " + name_prefix + "no" + name;
            }
        };

        if (force_set) {
            settings.forced_settings[name] = "forced";
            desc += " " + name + "=forced";
        }
        for (Action arg_action : arg_actions) {
            push_values(arg_action, "a", "-", settings.command_line_options[name]);
        }
        for (Action conf_action : conf_actions) {
            bool use_section = conf_action == SECTION_SET || conf_action == SECTION_NEGATE;
            push_values(conf_action, "c", use_section ? network + "." : "",
                settings.ro_config[use_section ? network : ""][name]);
        }

        desc += " || ";
        desc += GetSetting(settings, network, name, ignore_default_section_config, /*ignore_nonpersistent=*/false, /*get_chain_type=*/false).write();
        desc += " |";
        for (const auto& s : GetSettingsList(settings, network, name, ignore_default_section_config)) {
            desc += " ";
            desc += s.write();
        }
        desc += " |";
        if (OnlyHasDefaultSectionSetting(settings, network, name)) desc += " ignored";
        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   SETTINGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=settings_tests/Merge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || GetSetting() | GetSettingsList() | OnlyHasDefaultSectionSetting()
    BOOST_CHECK_EQUAL(out_sha_hex, "79db02d74e3e193196541b67c068b40ebd0c124a24b3ecbe9cbf7e85b1c4ba7a");
}